

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O1

QTransform * __thiscall
QGraphicsItemPrivate::TransformData::computedFullTransform
          (QTransform *__return_storage_ptr__,TransformData *this,QTransform *postmultiplyTransform)

{
  ushort uVar1;
  QGraphicsTransform *pQVar2;
  uint uVar3;
  long lVar4;
  qreal *pqVar5;
  TransformData *pTVar6;
  undefined4 *puVar7;
  qreal *pqVar8;
  undefined4 *puVar9;
  QTransform *pQVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  byte bVar12;
  QMatrix4x4 m;
  QTransform QStack_c8;
  undefined4 local_74;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  
  bVar12 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->onlyTransform != true) {
    pqVar5 = (qreal *)&DAT_00700eb8;
    pqVar8 = (qreal *)__return_storage_ptr__;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pqVar8 = *pqVar5;
      pqVar5 = pqVar5 + 1;
      pqVar8 = pqVar8 + 1;
    }
    pTVar6 = this;
    pqVar5 = (qreal *)__return_storage_ptr__;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pqVar5 = (pTVar6->transform).m_matrix[0][0];
      pTVar6 = (TransformData *)((pTVar6->transform).m_matrix[0] + 1);
      pqVar5 = pqVar5 + 1;
    }
    if ((this->graphicsTransforms).d.size != 0) {
      puVar7 = &DAT_00700e70;
      puVar9 = &local_74;
      for (lVar4 = 0x11; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar9 = *puVar7;
        puVar7 = puVar7 + 1;
        puVar9 = puVar9 + 1;
      }
      local_74 = 0x3f800000;
      local_70 = 0;
      uStack_68 = 0;
      local_60 = 0x3f800000;
      local_5c = 0;
      uStack_54 = 0;
      local_4c = 0x3f800000;
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0x3f800000;
      if ((this->graphicsTransforms).d.size != 0) {
        uVar11 = 0;
        do {
          pQVar2 = (this->graphicsTransforms).d.ptr[uVar11];
          (**(code **)(*(long *)pQVar2 + 0x60))(pQVar2,&local_74);
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)(this->graphicsTransforms).d.size);
      }
      QMatrix4x4::toTransform();
      QTransform::operator*=(__return_storage_ptr__,&QStack_c8);
    }
    QTransform::translate(this->xOrigin,this->yOrigin);
    QTransform::rotate(this->rotation,(Axis)__return_storage_ptr__);
    QTransform::scale(this->scale,this->scale);
    QTransform::translate(-this->xOrigin,-this->yOrigin);
    if (postmultiplyTransform != (QTransform *)0x0) {
      QTransform::operator*=(__return_storage_ptr__,postmultiplyTransform);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
    goto LAB_005f995a;
  }
  pQVar10 = __return_storage_ptr__;
  if (postmultiplyTransform != (QTransform *)0x0) {
    if ((*(ushort *)&postmultiplyTransform->field_0x48 & 0x3e0) == 0) {
      uVar3 = *(ushort *)&postmultiplyTransform->field_0x48 & 0x1f;
    }
    else {
      uVar3 = QTransform::type();
    }
    if (uVar3 != 0) {
      uVar1 = *(ushort *)&(this->transform).field_0x48;
      if ((uVar1 & 0x3e0) == 0) {
        uVar3 = uVar1 & 0x1f;
      }
      else {
        uVar3 = QTransform::type();
      }
      if (uVar3 != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          QTransform::operator*(__return_storage_ptr__,&this->transform);
          return __return_storage_ptr__;
        }
        goto LAB_005f995a;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_005f995a;
      lVar4 = 10;
      this = (TransformData *)postmultiplyTransform;
      goto LAB_005f98f9;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_005f995a:
    __stack_chk_fail();
  }
  lVar4 = 10;
LAB_005f98f9:
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    pQVar10->m_matrix[0][0] = (this->transform).m_matrix[0][0];
    this = (TransformData *)((long)this + (ulong)bVar12 * -0x10 + 8);
    pQVar10 = (QTransform *)((long)pQVar10 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

QTransform computedFullTransform(QTransform *postmultiplyTransform = nullptr) const
    {
        if (onlyTransform) {
            if (!postmultiplyTransform || postmultiplyTransform->isIdentity())
                return transform;
            if (transform.isIdentity())
                return *postmultiplyTransform;
            return transform * *postmultiplyTransform;
        }

        QTransform x(transform);
        if (!graphicsTransforms.isEmpty()) {
            QMatrix4x4 m;
            for (int i = 0; i < graphicsTransforms.size(); ++i)
                graphicsTransforms.at(i)->applyTo(&m);
            x *= m.toTransform();
        }
        x.translate(xOrigin, yOrigin);
        x.rotate(rotation);
        x.scale(scale, scale);
        x.translate(-xOrigin, -yOrigin);
        if (postmultiplyTransform)
            x *= *postmultiplyTransform;
        return x;
    }